

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

void NULLCMemory::write_double_array(NULLCArray buffer,int offset,NULLCArray value)

{
  char *error;
  uint uVar1;
  uint uVar2;
  
  uVar2 = value.len;
  if (buffer.ptr == (char *)0x0) {
    error = "buffer is empty";
  }
  else if (offset < 0) {
    error = "offset is negative";
  }
  else if ((int)uVar2 < 0) {
    error = "element count is negative";
  }
  else {
    error = "buffer overflow";
    uVar1 = buffer.len - offset;
    if (((uint)offset <= buffer.len && uVar1 != 0) && (uVar2 <= uVar1 >> 3)) {
      memcpy(buffer.ptr + (uint)offset,value.ptr,(ulong)uVar2 << 3);
      return;
    }
  }
  nullcThrowError(error);
  return;
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}